

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant_impl.hpp
# Opt level: O3

void __thiscall
type_safe::detail::
copy_assign_union_value<type_safe::optional_variant_policy,type_safe::tagged_union<int,double,debugger_type>>
::visitor::operator()(void *this,int *value,tagged_union<int,_double,_debugger_type> *dest)

{
  int iVar1;
  
  if ((dest->cur_type_).
      super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
      .value_ == 1) {
    iVar1 = *value;
    tagged_union<int,_double,_debugger_type>::check<int>(dest);
  }
  else {
    destroy_union<type_safe::tagged_union<int,_double,_debugger_type>_>::destroy(dest);
    iVar1 = *value;
    (dest->cur_type_).
    super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
    .value_ = 1;
  }
  *(int *)(dest->storage_).storage_ = iVar1;
  return;
}

Assistant:

void operator()(const T& value, Union& dest)
            {
                constexpr auto id = typename Union::type_id(union_type<T>{});
                if (dest.type() == id)
                    do_assign(dest, value);
                else
                    VariantPolicy::change_value(union_type<T>{}, dest, value);
            }